

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O2

char * fy_node_get_short_path(fy_node *fyn)

{
  fy_node *fyn_parent;
  long lVar1;
  long lVar2;
  size_t __maxlen;
  int iVar3;
  int iVar4;
  fy_anchor *fya;
  char *pcVar5;
  char *pcVar6;
  size_t sVar7;
  char *pcVar8;
  ulong uVar9;
  char *__dest;
  char *pcVar10;
  undefined8 uStack_60;
  char acStack_58 [12];
  int local_4c;
  uint local_48 [2];
  size_t len;
  char *local_38;
  
  pcVar6 = acStack_58;
  if (fyn != (fy_node *)0x0) {
    uStack_60 = 0x12126e;
    fya = fy_node_get_nearest_anchor(fyn);
    if (fya == (fy_anchor *)0x0) {
      pcVar6 = fy_node_get_path(fyn);
      return pcVar6;
    }
    fyn_parent = fya->fyn;
    uStack_60 = 0x121287;
    pcVar5 = fy_anchor_get_text(fya,(size_t *)local_48);
    if (pcVar5 != (char *)0x0) {
      if (fyn_parent == fyn) {
        uStack_60 = 0x12132a;
        iVar3 = snprintf((char *)0x0,0,"*%.*s",(ulong)local_48[0],pcVar5);
        pcVar10 = (char *)0x0;
        if (iVar3 != -1) {
          lVar1 = -((long)iVar3 + 0x10U & 0xfffffffffffffff0);
          pcVar6 = acStack_58 + lVar1;
          *(undefined8 *)((long)&uStack_60 + lVar1) = 0x121364;
          iVar4 = snprintf(pcVar6,(long)iVar3 + 1,"*%.*s",(ulong)local_48[0],pcVar5);
          if (iVar3 != iVar4) {
            *(code **)((long)&uStack_60 + lVar1) = fy_node_build_from_string;
            __assert_fail("_size == _sizew",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                          ,0x116b,"char *fy_node_get_short_path(struct fy_node *)");
          }
          *(undefined8 *)((long)&uStack_60 + lVar1) = 0x121375;
          sVar7 = strlen(pcVar6);
          pcVar5 = pcVar6 + sVar7;
          while ((pcVar10 = pcVar6, pcVar6 < pcVar5 && (pcVar5[-1] == '\n'))) {
            pcVar5 = pcVar5 + -1;
            *pcVar5 = '\0';
          }
        }
      }
      else {
        len = CONCAT44(len._4_4_,local_48[0]);
        uStack_60 = 0x1212a5;
        pcVar6 = fy_node_get_path_relative_to(fyn_parent,fyn);
        if (pcVar6 == (char *)0x0) {
          pcVar10 = (char *)0x0;
          pcVar6 = acStack_58;
        }
        else {
          uStack_60 = 0x1212b9;
          sVar7 = strlen(pcVar6);
          lVar1 = -(sVar7 + 0x10 & 0xfffffffffffffff0);
          pcVar10 = acStack_58 + lVar1;
          local_38 = pcVar5;
          *(undefined8 *)((long)&uStack_60 + lVar1) = 0x1212df;
          memcpy(pcVar10,pcVar6,sVar7);
          pcVar10[sVar7] = '\0';
          pcVar5 = local_38;
          *(undefined8 *)((long)&uStack_60 + lVar1) = 0x1212f0;
          free(pcVar6);
          pcVar6 = pcVar10;
        }
        if (pcVar10 == (char *)0x0) {
          pcVar10 = "";
        }
        uVar9 = len & 0xffffffff;
        pcVar6[-8] = -0x3e;
        pcVar6[-7] = '\x13';
        pcVar6[-6] = '\x12';
        pcVar6[-5] = '\0';
        pcVar6[-4] = '\0';
        pcVar6[-3] = '\0';
        pcVar6[-2] = '\0';
        pcVar6[-1] = '\0';
        iVar3 = snprintf((char *)0x0,0,"*%.*s/%s",uVar9,pcVar5,pcVar10);
        pcVar10 = (char *)0x0;
        if (iVar3 != -1) {
          len = (long)iVar3 + 1;
          lVar1 = -((long)iVar3 + 0x10U & 0xfffffffffffffff0);
          pcVar10 = pcVar6 + lVar1;
          local_38 = (char *)CONCAT44(local_38._4_4_,local_48[0]);
          pcVar10[-8] = -6;
          pcVar10[-7] = '\x13';
          pcVar10[-6] = '\x12';
          pcVar10[-5] = '\0';
          pcVar10[-4] = '\0';
          pcVar10[-3] = '\0';
          pcVar10[-2] = '\0';
          pcVar10[-1] = '\0';
          pcVar8 = fy_node_get_path_relative_to(fyn_parent,fyn);
          if (pcVar8 == (char *)0x0) {
            __dest = (char *)0x0;
            pcVar6 = pcVar10;
          }
          else {
            builtin_strncpy(pcVar6 + lVar1 + -8,"\n\x14\x12",4);
            pcVar10[-4] = '\0';
            pcVar10[-3] = '\0';
            pcVar10[-2] = '\0';
            pcVar10[-1] = '\0';
            sVar7 = strlen(pcVar8);
            lVar2 = -(sVar7 + 0x10 & 0xfffffffffffffff0);
            __dest = pcVar10 + lVar2;
            local_4c = iVar3;
            builtin_strncpy(pcVar6 + lVar2 + lVar1 + -8,"3\x14\x12",4);
            __dest[-4] = '\0';
            __dest[-3] = '\0';
            __dest[-2] = '\0';
            __dest[-1] = '\0';
            memcpy(__dest,pcVar8,sVar7);
            __dest[sVar7] = '\0';
            iVar3 = local_4c;
            builtin_strncpy(pcVar6 + lVar2 + lVar1 + -8,"G\x14\x12",4);
            __dest[-4] = '\0';
            __dest[-3] = '\0';
            __dest[-2] = '\0';
            __dest[-1] = '\0';
            free(pcVar8);
            pcVar6 = __dest;
          }
          __maxlen = len;
          pcVar8 = "";
          if (__dest != (char *)0x0) {
            pcVar8 = __dest;
          }
          uVar9 = (ulong)local_38 & 0xffffffff;
          builtin_strncpy(pcVar6 + -8,"u\x14\x12",4);
          pcVar6[-4] = '\0';
          pcVar6[-3] = '\0';
          pcVar6[-2] = '\0';
          pcVar6[-1] = '\0';
          iVar4 = snprintf(pcVar10,__maxlen,"*%.*s/%s",uVar9,pcVar5,pcVar8);
          if (iVar3 != iVar4) {
            pcVar6[-8] = -0x32;
            pcVar6[-7] = '\x14';
            pcVar6[-6] = '\x12';
            pcVar6[-5] = '\0';
            pcVar6[-4] = '\0';
            pcVar6[-3] = '\0';
            pcVar6[-2] = '\0';
            pcVar6[-1] = '\0';
            __assert_fail("_size == _sizew",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                          ,0x116e,"char *fy_node_get_short_path(struct fy_node *)");
          }
          pcVar6[-8] = -0x7e;
          pcVar6[-7] = '\x14';
          pcVar6[-6] = '\x12';
          pcVar6[-5] = '\0';
          pcVar6[-4] = '\0';
          pcVar6[-3] = '\0';
          pcVar6[-2] = '\0';
          pcVar6[-1] = '\0';
          sVar7 = strlen(pcVar10);
          pcVar5 = pcVar10 + sVar7;
          while ((pcVar10 < pcVar5 && (pcVar5[-1] == '\n'))) {
            pcVar5 = pcVar5 + -1;
            *pcVar5 = '\0';
          }
        }
      }
      pcVar6[-8] = -0x60;
      pcVar6[-7] = '\x14';
      pcVar6[-6] = '\x12';
      pcVar6[-5] = '\0';
      pcVar6[-4] = '\0';
      pcVar6[-3] = '\0';
      pcVar6[-2] = '\0';
      pcVar6[-1] = '\0';
      pcVar6 = strdup(pcVar10);
      return pcVar6;
    }
  }
  return (char *)0x0;
}

Assistant:

char *fy_node_get_short_path(struct fy_node *fyn) {
    struct fy_node *fyn_anchor;
    struct fy_anchor *fya;
    const char *text;
    size_t len;
    const char *str;
    char *path;

    if (!fyn)
        return NULL;

    /* get the nearest anchor traversing upwards */
    fya = fy_node_get_nearest_anchor(fyn);
    if (!fya)
        return fy_node_get_path(fyn);

    fyn_anchor = fy_anchor_node(fya);

    text = fy_anchor_get_text(fya, &len);
    if (!text)
        return NULL;

    if (fyn_anchor == fyn)
        str = alloca_sprintf("*%.*s", (int) len, text);
    else
        str = alloca_sprintf("*%.*s/%s", (int) len, text,
                             fy_node_get_path_relative_to_alloca(fyn_anchor, fyn));

    path = strdup(str);
    return path;
}